

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiOldColumnFlags flags)

{
  float fVar1;
  ImGuiContext *pIVar2;
  ImGuiID id_00;
  ImGuiWindow *window_00;
  ImGuiOldColumns *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float width;
  float offset_1;
  float offset_0;
  ImVec2 local_88;
  float local_80;
  float local_7c;
  float clip_x2;
  float clip_x1;
  ImGuiOldColumnData *column_1;
  undefined1 local_68 [4];
  int n_1;
  ImGuiOldColumnData column;
  int n;
  float max_2;
  float max_1;
  float half_clip_extend_x;
  float column_padding;
  ImGuiOldColumns *columns;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiOldColumnFlags flags_local;
  int columns_count_local;
  char *str_id_local;
  
  pIVar2 = GImGui;
  window_00 = GetCurrentWindow();
  if (columns_count < 1) {
    __assert_fail("columns_count >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                  ,0xe54,"void ImGui::BeginColumns(const char *, int, ImGuiOldColumnFlags)");
  }
  if ((window_00->DC).CurrentColumns != (ImGuiOldColumns *)0x0) {
    __assert_fail("window->DC.CurrentColumns == __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                  ,0xe55,"void ImGui::BeginColumns(const char *, int, ImGuiOldColumnFlags)");
  }
  id_00 = GetColumnsID(str_id,columns_count);
  pIVar3 = FindOrCreateColumns(window_00,id_00);
  if (pIVar3->ID != id_00) {
    __assert_fail("columns->ID == id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                  ,0xe5a,"void ImGui::BeginColumns(const char *, int, ImGuiOldColumnFlags)");
  }
  pIVar3->Current = 0;
  pIVar3->Count = columns_count;
  pIVar3->Flags = flags;
  (window_00->DC).CurrentColumns = pIVar3;
  pIVar3->HostCursorPosY = (window_00->DC).CursorPos.y;
  pIVar3->HostCursorMaxPosX = (window_00->DC).CursorMaxPos.x;
  (pIVar3->HostInitialClipRect).Min = (window_00->ClipRect).Min;
  (pIVar3->HostInitialClipRect).Max = (window_00->ClipRect).Max;
  (pIVar3->HostBackupParentWorkRect).Min = (window_00->ParentWorkRect).Min;
  (pIVar3->HostBackupParentWorkRect).Max = (window_00->ParentWorkRect).Max;
  (window_00->ParentWorkRect).Min = (window_00->WorkRect).Min;
  (window_00->ParentWorkRect).Max = (window_00->WorkRect).Max;
  fVar1 = (pIVar2->Style).ItemSpacing.x;
  fVar4 = ImMax<float>((window_00->WindowPadding).x * 0.5,window_00->WindowBorderSize);
  fVar5 = ImFloor(fVar4);
  fVar4 = (window_00->WorkRect).Max.x;
  fVar6 = ImMax<float>(fVar1 - (window_00->WindowPadding).x,0.0);
  column.ClipRect.Max.y = (window_00->WorkRect).Max.x + fVar5;
  fVar5 = (window_00->DC).Indent.x;
  fVar7 = ImMax<float>(fVar1 - (window_00->WindowPadding).x,0.0);
  pIVar3->OffMinX = (fVar5 - fVar1) + fVar7;
  fVar4 = ImMin<float>((fVar4 + fVar1) - fVar6,column.ClipRect.Max.y);
  fVar4 = ImMax<float>(fVar4 - (window_00->Pos).x,pIVar3->OffMinX + 1.0);
  pIVar3->OffMaxX = fVar4;
  fVar4 = (window_00->DC).CursorPos.y;
  pIVar3->LineMaxY = fVar4;
  pIVar3->LineMinY = fVar4;
  if (((pIVar3->Columns).Size != 0) && ((pIVar3->Columns).Size != columns_count + 1)) {
    ImVector<ImGuiOldColumnData>::resize(&pIVar3->Columns,0);
  }
  pIVar3->IsFirstFrame = (pIVar3->Columns).Size == 0;
  if ((pIVar3->Columns).Size == 0) {
    ImVector<ImGuiOldColumnData>::reserve(&pIVar3->Columns,columns_count + 1);
    for (column.ClipRect.Max.x = 0.0; (int)column.ClipRect.Max.x < columns_count + 1;
        column.ClipRect.Max.x = (float)((int)column.ClipRect.Max.x + 1)) {
      ImGuiOldColumnData::ImGuiOldColumnData((ImGuiOldColumnData *)local_68);
      local_68 = (undefined1  [4])((float)(int)column.ClipRect.Max.x / (float)columns_count);
      ImVector<ImGuiOldColumnData>::push_back(&pIVar3->Columns,(ImGuiOldColumnData *)local_68);
    }
  }
  for (column_1._4_4_ = 0; column_1._4_4_ < columns_count; column_1._4_4_ = column_1._4_4_ + 1) {
    _clip_x2 = ImVector<ImGuiOldColumnData>::operator[](&pIVar3->Columns,column_1._4_4_);
    fVar4 = (window_00->Pos).x;
    fVar5 = GetColumnOffset(column_1._4_4_);
    local_7c = (float)(int)(fVar4 + fVar5 + 0.5);
    fVar4 = (window_00->Pos).x;
    fVar5 = GetColumnOffset(column_1._4_4_ + 1);
    local_80 = (float)(int)(((fVar4 + fVar5) - 1.0) + 0.5);
    ImRect::ImRect((ImRect *)&offset_1,local_7c,-3.4028235e+38,local_80,3.4028235e+38);
    (_clip_x2->ClipRect).Min = _offset_1;
    (_clip_x2->ClipRect).Max = local_88;
    ImRect::ClipWithFull(&_clip_x2->ClipRect,&window_00->ClipRect);
  }
  if (1 < pIVar3->Count) {
    ImDrawListSplitter::Split(&pIVar3->Splitter,window_00->DrawList,pIVar3->Count + 1);
    ImDrawListSplitter::SetCurrentChannel(&pIVar3->Splitter,window_00->DrawList,1);
    PushColumnClipRect(0);
  }
  fVar4 = GetColumnOffset(pIVar3->Current);
  fVar5 = GetColumnOffset(pIVar3->Current + 1);
  PushItemWidth((fVar5 - fVar4) * 0.65);
  fVar4 = ImMax<float>(fVar1 - (window_00->WindowPadding).x,0.0);
  (window_00->DC).ColumnsOffset.x = fVar4;
  (window_00->DC).CursorPos.x =
       (float)(int)((window_00->Pos).x + (window_00->DC).Indent.x + (window_00->DC).ColumnsOffset.x)
  ;
  (window_00->WorkRect).Max.x = ((window_00->Pos).x + fVar5) - fVar1;
  return;
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiOldColumnFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count >= 1);
    IM_ASSERT(window->DC.CurrentColumns == NULL);   // Nested columns are currently not supported

    // Acquire storage for the columns set
    ImGuiID id = GetColumnsID(str_id, columns_count);
    ImGuiOldColumns* columns = FindOrCreateColumns(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.CurrentColumns = columns;

    columns->HostCursorPosY = window->DC.CursorPos.y;
    columns->HostCursorMaxPosX = window->DC.CursorMaxPos.x;
    columns->HostInitialClipRect = window->ClipRect;
    columns->HostBackupParentWorkRect = window->ParentWorkRect;
    window->ParentWorkRect = window->WorkRect;

    // Set state for first column
    // We aim so that the right-most column will have the same clipping width as other after being clipped by parent ClipRect
    const float column_padding = g.Style.ItemSpacing.x;
    const float half_clip_extend_x = ImFloor(ImMax(window->WindowPadding.x * 0.5f, window->WindowBorderSize));
    const float max_1 = window->WorkRect.Max.x + column_padding - ImMax(column_padding - window->WindowPadding.x, 0.0f);
    const float max_2 = window->WorkRect.Max.x + half_clip_extend_x;
    columns->OffMinX = window->DC.Indent.x - column_padding + ImMax(column_padding - window->WindowPadding.x, 0.0f);
    columns->OffMaxX = ImMax(ImMin(max_1, max_2) - window->Pos.x, columns->OffMinX + 1.0f);
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize default widths
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiOldColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiOldColumnData* column = &columns->Columns[n];
        float clip_x1 = IM_ROUND(window->Pos.x + GetColumnOffset(n));
        float clip_x2 = IM_ROUND(window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWithFull(window->ClipRect);
    }

    if (columns->Count > 1)
    {
        columns->Splitter.Split(window->DrawList, 1 + columns->Count);
        columns->Splitter.SetCurrentChannel(window->DrawList, 1);
        PushColumnClipRect(0);
    }

    // We don't generally store Indent.x inside ColumnsOffset because it may be manipulated by the user.
    float offset_0 = GetColumnOffset(columns->Current);
    float offset_1 = GetColumnOffset(columns->Current + 1);
    float width = offset_1 - offset_0;
    PushItemWidth(width * 0.65f);
    window->DC.ColumnsOffset.x = ImMax(column_padding - window->WindowPadding.x, 0.0f);
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->WorkRect.Max.x = window->Pos.x + offset_1 - column_padding;
}